

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtrclient.c
# Opt level: O1

void print_templates(void)

{
  long lVar1;
  char *pcVar2;
  int iVar3;
  pfx_output_template *ppVar4;
  char *__s1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __s1 = "default";
  ppVar4 = templates;
  do {
    pcVar2 = template_name;
    ppVar4 = ppVar4 + 1;
    if (template_name == (char *)0x0) {
LAB_00104b74:
      puts(__s1);
    }
    else {
      iVar3 = strcmp(__s1,template_name);
      if (iVar3 == 0) {
        printf("%s",ppVar4[-1].template);
      }
      else if (pcVar2 == (char *)0x0) goto LAB_00104b74;
    }
    __s1 = ppVar4->name;
    if (__s1 == (char *)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return;
      }
      __stack_chk_fail();
    }
  } while( true );
}

Assistant:

static void print_templates(void)
{
	const struct pfx_output_template *current = templates;

	while (current->name) {
		if (template_name && strcmp(current->name, template_name) == 0)
			printf("%s", current->template);
		else if (!template_name)
			printf("%s\n", current->name);

		++current;
	}
}